

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O1

void sznet::CurrentThread::cacheTid(void)

{
  int iVar1;
  ulong uVar2;
  long *in_FS_OFFSET;
  
  if ((int)in_FS_OFFSET[-6] != 0) {
    return;
  }
  uVar2 = syscall(0xba);
  *(int *)(in_FS_OFFSET + -6) = (int)uVar2;
  iVar1 = snprintf((char *)(*in_FS_OFFSET + -0x20),0x20,"%5d ",uVar2 & 0xffffffff);
  *(int *)(in_FS_OFFSET + -0x52) = iVar1;
  return;
}

Assistant:

void cacheTid()
{
	if (t_cachedTid == 0)
	{
#if defined(SZ_OS_WINDOWS)
		t_cachedTid = GetCurrentThreadId();
#else
		t_cachedTid = syscall(SYS_gettid);
#endif
		t_tidStringLength = snprintf(t_tidString, sizeof(t_tidString), "%5d ", t_cachedTid);
	}
}